

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# full_gal_tests.cc
# Opt level: O0

void __thiscall
lf::uscalfe::test::lf_full_bd_a_1_Test::~lf_full_bd_a_1_Test(lf_full_bd_a_1_Test *this)

{
  lf_full_bd_a_1_Test *this_local;
  
  ~lf_full_bd_a_1_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(lf_full, bd_a_1) {
  // Four levels of refinement
  const int reflevels = REFLEV;
  std::cout << "<<<< TEST: Boundary energy test 1, linear f >>>>" << std::endl;

  std::cout << "eta = 1 => energy = 32/3 " << std::endl;
  // Synthetic function
  auto v = mesh::utils::MeshFunctionGlobal(
      [](Eigen::Vector2d x) -> double { return (2.0 * x[0] + x[1]); });
  // Impedance coefficient
  auto eta = mesh::utils::MeshFunctionGlobal(
      [](Eigen::Vector2d x) -> double { return 1.0; });

  auto en{LinFEInterfaceEnergyTest(reflevels, v, eta)};
  EXPECT_NEAR(en.back(), 32.0 / 3.0, 1.0E-4);
}